

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

int mk_node(dtree_node_t *node,uint32 node_id,uint32 *id,uint32 n_id,float32 ****mixw,
           float32 ****means,float32 ****vars,uint32 *veclen,uint32 n_model,uint32 n_state,
           uint32 n_stream,uint32 n_density,float32 *stwt,float32 mwfloor)

{
  double dVar1;
  uint uVar2;
  float32 *pfVar3;
  float32 *pfVar4;
  float *pfVar5;
  long lVar6;
  int iVar7;
  cmd_ln_t *pcVar8;
  char *__s1;
  ulong uVar9;
  float32 ***pppfVar10;
  void *tmpptr;
  void *ptr;
  uint32 *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong d2;
  ulong uVar16;
  float32 *pfVar17;
  float32 *pfVar18;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float32 fVar26;
  double local_70;
  float32 ***local_68;
  float32 ***local_60;
  
  pcVar8 = cmd_ln_get();
  __s1 = cmd_ln_str_r(pcVar8,"-ts2cbfn");
  iVar7 = strcmp(__s1,".semi.");
  if ((iVar7 != 0) && (iVar7 = strcmp(__s1,".cont."), iVar7 != 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
            ,0x326,"Type %s unsupported; trees can only be built on types .semi. or .cont.\n",__s1);
LAB_0010e58c:
    exit(1);
  }
  iVar7 = strcmp(__s1,".cont.");
  d2 = (ulong)n_stream;
  uVar13 = (ulong)n_state;
  if (iVar7 == 0) {
    pcVar8 = cmd_ln_get();
    dVar22 = cmd_ln_float_r(pcVar8,"-varfloor");
    uVar16 = 0;
    if (n_stream != 0) {
      uVar9 = 0;
      do {
        uVar15 = (int)uVar16 + veclen[uVar9];
        uVar16 = (ulong)uVar15;
        uVar9 = uVar9 + 1;
      } while (d2 != uVar9);
      uVar16 = (ulong)uVar15;
    }
    fVar21 = (float)dVar22;
    local_60 = (float32 ***)
               __ckd_calloc_3d__(uVar13,d2,uVar16,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                 ,0x331);
    local_68 = (float32 ***)
               __ckd_calloc_3d__(uVar13,d2,uVar16,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                 ,0x332);
  }
  else {
    fVar21 = 0.0;
    local_60 = (float32 ***)0x0;
    local_68 = (float32 ***)0x0;
  }
  uVar9 = (ulong)n_density;
  pppfVar10 = (float32 ***)
              __ckd_calloc_3d__(uVar13,d2,uVar9,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                ,0x335);
  tmpptr = __ckd_calloc_2d__(d2,uVar9,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                             ,0x336);
  ptr = __ckd_calloc__(d2,8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                       ,0x337);
  uVar16 = (ulong)n_id;
  if (n_state == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      if (n_stream != 0) {
        uVar14 = 0;
        do {
          if (iVar7 == 0) {
            pfVar17 = local_60[uVar12][uVar14];
            pfVar18 = local_68[uVar12][uVar14];
          }
          else {
            pfVar17 = (float32 *)0x0;
            pfVar18 = (float32 *)0x0;
          }
          if (n_id != 0) {
            uVar19 = 0;
            do {
              uVar15 = id[uVar19];
              if (n_density != 0) {
                pfVar3 = mixw[uVar15][uVar12][uVar14];
                pfVar4 = pppfVar10[uVar12][uVar14];
                uVar20 = 0;
                do {
                  pfVar4[uVar20] = (float32)((float)pfVar3[uVar20] + (float)pfVar4[uVar20]);
                  uVar20 = uVar20 + 1;
                } while (uVar9 != uVar20);
              }
              if ((iVar7 == 0) && (uVar2 = veclen[uVar14], (ulong)uVar2 != 0)) {
                pfVar5 = (float *)mixw[uVar15][uVar12][uVar14];
                pfVar3 = means[uVar15][uVar12][uVar14];
                pfVar4 = vars[uVar15][uVar12][uVar14];
                uVar20 = 0;
                do {
                  pfVar17[uVar20] =
                       (float32)(*pfVar5 * (float)pfVar3[uVar20] + (float)pfVar17[uVar20]);
                  fVar24 = (float)pfVar3[uVar20];
                  pfVar18[uVar20] =
                       (float32)((fVar24 * fVar24 + (float)pfVar4[uVar20]) * *pfVar5 +
                                (float)pfVar18[uVar20]);
                  uVar20 = uVar20 + 1;
                } while (uVar2 != uVar20);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar16);
          }
          if (iVar7 == 0) {
            pfVar5 = (float *)pppfVar10[uVar12][uVar14];
            uVar19 = (ulong)veclen[uVar14];
            if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
              if (uVar19 != 0) {
                uVar20 = 0;
                do {
                  fVar24 = (float)pfVar17[uVar20] / *pfVar5;
                  pfVar17[uVar20] = (float32)fVar24;
                  fVar25 = (float)pfVar18[uVar20] / *pfVar5 - fVar24 * fVar24;
                  fVar24 = fVar21;
                  if (fVar21 <= fVar25) {
                    fVar24 = fVar25;
                  }
                  pfVar18[uVar20] = (float32)fVar24;
                  uVar20 = uVar20 + 1;
                } while (uVar19 != uVar20);
              }
            }
            else if (uVar19 != 0) {
              uVar20 = 0;
              do {
                fVar24 = (float)pfVar17[uVar20];
                if ((fVar24 != 0.0) || (NAN(fVar24))) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                          ,0x35c,"denominator = 0, but numerator = %f at k = %d\n",(double)fVar24);
                  goto LAB_0010e58c;
                }
                uVar20 = uVar20 + 1;
              } while (uVar19 != uVar20);
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != d2);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
    uVar14 = 0;
    fVar21 = 0.0;
    uVar12 = 0;
    do {
      if (fVar21 < (float)stwt[uVar14]) {
        uVar12 = uVar14 & 0xffffffff;
        fVar21 = (float)stwt[uVar14];
      }
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  if (n_density == 0) {
    fVar21 = 0.0;
  }
  else {
    fVar21 = 0.0;
    uVar14 = 0;
    do {
      fVar21 = fVar21 + (float)(*pppfVar10[uVar12])[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar9 != uVar14);
  }
  if (n_state == 0) {
    local_70 = 0.0;
  }
  else {
    local_70 = 0.0;
    uVar12 = 0;
    do {
      dVar22 = 0.0;
      if (n_stream != 0) {
        uVar14 = 0;
        do {
          *(undefined8 *)((long)ptr + uVar14 * 8) = 0;
          if (n_density != 0) {
            dVar22 = *(double *)((long)ptr + uVar14 * 8);
            uVar19 = 0;
            do {
              dVar22 = dVar22 + (double)(float)pppfVar10[uVar12][uVar14][uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar9 != uVar19);
            *(double *)((long)ptr + uVar14 * 8) = dVar22;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != d2);
        dVar22 = 0.0;
        if (n_stream != 0) {
          uVar14 = 0;
          do {
            dVar1 = *(double *)((long)ptr + uVar14 * 8);
            if (iVar7 == 0) {
              dVar23 = (double)ent_cont(local_60[uVar12][uVar14],local_68[uVar12][uVar14],
                                        veclen[uVar14]);
            }
            else {
              if (n_density != 0) {
                pfVar17 = pppfVar10[uVar12][uVar14];
                lVar6 = *(long *)((long)tmpptr + uVar14 * 8);
                uVar19 = 0;
                do {
                  fVar24 = (float)((double)(float)pfVar17[uVar19] * (1.0 / dVar1));
                  fVar26 = mwfloor;
                  if ((float)mwfloor <= fVar24) {
                    fVar26 = (float32)fVar24;
                  }
                  *(float32 *)(lVar6 + uVar19 * 4) = fVar26;
                  uVar19 = uVar19 + 1;
                } while (uVar9 != uVar19);
              }
              dVar23 = (double)ent_d(*(float32 **)((long)tmpptr + uVar14 * 8),n_density);
            }
            dVar22 = dVar22 + dVar1 * dVar23;
            uVar14 = uVar14 + 1;
          } while (uVar14 != d2);
        }
      }
      local_70 = local_70 + (double)(float)stwt[uVar12] * dVar22;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
  }
  node->node_id = node_id;
  puVar11 = (uint32 *)
            __ckd_calloc__(uVar16,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                           ,0x38d);
  if (n_id != 0) {
    uVar13 = 0;
    do {
      puVar11[uVar13] = id[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar16 != uVar13);
  }
  node->id = puVar11;
  node->n_id = n_id;
  node->mixw_occ = pppfVar10;
  if (iVar7 == 0) {
    node->means = local_60;
    node->vars = local_68;
  }
  node->occ = (float32)fVar21;
  node->wt_ent = (float64)local_70;
  ckd_free_2d(tmpptr);
  ckd_free(ptr);
  return 0;
}

Assistant:

int
mk_node(dtree_node_t *node,
	uint32 node_id,
	uint32 *id,
	uint32 n_id,
	float32 ****mixw,
        float32 ****means,
        float32 ****vars,
        uint32  *veclen,
	uint32 n_model,
	uint32 n_state,
	uint32 n_stream,
	uint32 n_density,
	float32 *stwt,
	float32 mwfloor)
{
    float32 ***mixw_occ, **dist;
    uint32 mm, m, s, j, k;
    float64 *dnom, norm, wt_ent, s_wt_ent, occ;
    float32 mx_wt;
    uint32 *l_id;
    float32 ***lmeans=0,***lvars=0;
    float32 varfloor=0;
    uint32 continuous, sumveclen;
    char*  type;

    type = (char *)cmd_ln_str("-ts2cbfn");
    if (strcmp(type,".semi.")!=0 && strcmp(type,".cont.") != 0)
        E_FATAL("Type %s unsupported; trees can only be built on types .semi. or .cont.\n",type);
    if (strcmp(type,".cont.") == 0) 
        continuous = 1;
    else 
        continuous = 0;

    if (continuous == 1) {
        varfloor = cmd_ln_float32("-varfloor");
        /* Sumveclen is overallocation, but coding is simpler */
        for (j=0,sumveclen=0; j < n_stream; j++) sumveclen += veclen[j];

        lmeans   = (float32 ***) ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        lvars   = (float32 ***) ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
    }

    mixw_occ = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));
    dist     = (float32 **)ckd_calloc_2d(n_stream, n_density, sizeof(float32));
    dnom     = (float64 *)ckd_calloc(n_stream, sizeof(float64));

    /* Merge distributions of all the elements in a cluster for combined
       distribution */
    for (s = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
            float32 *lmeanvec=0, *lvarvec=0;
            if (continuous == 1) {
                lmeanvec = lmeans[s][j];
                lvarvec = lvars[s][j];
            }
	    for (mm = 0; mm < n_id; mm++) {
	        m = id[mm];
		for (k = 0; k < n_density; k++) {
		    mixw_occ[s][j][k] += mixw[m][s][j][k];
		}
                /* For continuous hmms we have only one gaussian per state */
                if (continuous == 1) {
                    for (k = 0; k < veclen[j]; k++) {
                        lmeanvec[k] += mixw[m][s][j][0] * means[m][s][j][k];
                        lvarvec[k] += mixw[m][s][j][0] * (vars[m][s][j][k] + 
                                        means[m][s][j][k] * means[m][s][j][k]);
	            }
	        }
	    }
            if (continuous == 1) {
                if (mixw_occ[s][j][0] != 0) {
                    for (k = 0; k < veclen[j]; k++) {
                        lmeanvec[k] /= mixw_occ[s][j][0];
                        lvarvec[k] = lvarvec[k]/mixw_occ[s][j][0] - 
                                            lmeanvec[k]*lmeanvec[k];
                        if (lvarvec[k] < varfloor) lvarvec[k] = varfloor;
	            }
	        }
                else {
                    for (k = 0; k < veclen[j]; k++) 
                        if (lmeanvec[k] != 0)
                            E_FATAL("denominator = 0, but numerator = %f at k = %d\n",lmeanvec[k],k);
                }
	    }
	}
    }

    /* Find out which state is under consideration */
    for (j = 0, mx_wt = 0, s = 0; s < n_state; s++) {
	if (stwt[s] > mx_wt) {
	    mx_wt = stwt[s];
	    j = s;
	}
    }

    /* occ is the same for each independent feature, so just choose 0 */
    for (k = 0, occ = 0; k < n_density; k++) {
	occ += mixw_occ[j][0][k];
    }

    for (s = 0, wt_ent = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0, dnom[j] = 0; k < n_density; k++) {
	        dnom[j] += mixw_occ[s][j][k];
	    }
	}

	for (j = 0, s_wt_ent = 0; j < n_stream; j++) {
	    norm = 1.0 / dnom[j];

            /* discrete_entropy for discrete case, continuous entropy for
               continuous HMMs */
            if (continuous != 1) {
	        for (k = 0; k < n_density; k++) {
	    	    dist[j][k] = mixw_occ[s][j][k] * norm;
		    if (dist[j][k] < mwfloor)
		        dist[j][k] = mwfloor;
	        }

	        s_wt_ent += dnom[j] * ent_d(dist[j], n_density);
            }
            else {
	        s_wt_ent += dnom[j] * ent_cont(lmeans[s][j], lvars[s][j], veclen[j]);
            }
	}

	wt_ent += stwt[s] * s_wt_ent;
    }

    node->node_id = node_id;
    l_id = ckd_calloc(n_id, sizeof(uint32));
    for (j = 0; j < n_id; j++) {
	l_id[j] = id[j];
    }
    node->id = l_id;
    node->n_id = n_id;
    node->mixw_occ = mixw_occ;
    if (continuous == 1) {
        node->means = lmeans;
        node->vars = lvars;
    }
    node->occ = occ;
    node->wt_ent = wt_ent;

    ckd_free_2d((void **)dist);
    ckd_free((void *)dnom);

    return S3_SUCCESS;
}